

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O3

bool __thiscall sf::Texture::create(Texture *this,uint width,uint height)

{
  Uint64 UVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  Vector2u VVar6;
  undefined8 in_RCX;
  undefined7 uVar7;
  uint uVar8;
  GLint GVar9;
  uint uVar10;
  TransientContextLock lock;
  TextureSaver save;
  GLuint texture;
  undefined4 local_34;
  
  uVar7 = (undefined7)((ulong)in_RCX >> 8);
  if (width == 0 || height == 0) {
    poVar5 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Failed to create texture, invalid size (",0x28);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"x",1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    local_34 = 0;
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(&lock);
    priv::ensureExtensionsInit();
    uVar8 = width;
    uVar10 = height;
    if (SF_GLAD_GL_ARB_texture_non_power_of_two == 0) {
      uVar10 = 1;
      do {
        uVar8 = uVar10;
        uVar10 = uVar8 * 2;
      } while (uVar8 < width);
      uVar3 = 1;
      do {
        uVar10 = uVar3;
        uVar3 = uVar10 * 2;
      } while (uVar10 < height);
    }
    uVar3 = getMaximumSize();
    local_34 = (undefined4)CONCAT71(uVar7,uVar10 <= uVar3 && uVar8 <= uVar3);
    if (uVar10 <= uVar3 && uVar8 <= uVar3) {
      (this->m_size).x = width;
      (this->m_size).y = height;
      VVar6.y = uVar10;
      VVar6.x = uVar8;
      this->m_actualSize = VVar6;
      this->m_pixelsFlipped = false;
      this->m_fboAttachment = false;
      if (this->m_texture == 0) {
        (*sf_glad_glGenTextures)(1,&texture);
        this->m_texture = texture;
      }
      priv::TextureSaver::TextureSaver(&save);
      if (create(unsigned_int,unsigned_int)::textureEdgeClamp == '\0') {
        iVar4 = __cxa_guard_acquire(&create(unsigned_int,unsigned_int)::textureEdgeClamp);
        if (iVar4 != 0) {
          bVar2 = true;
          if (SF_GLAD_GL_VERSION_1_2 == 0 && SF_GLAD_GL_SGIS_texture_edge_clamp == 0) {
            bVar2 = Context::isExtensionAvailable("GL_EXT_texture_edge_clamp");
          }
          create::textureEdgeClamp = bVar2;
          __cxa_guard_release(&create(unsigned_int,unsigned_int)::textureEdgeClamp);
        }
      }
      if (((this->m_isRepeated == false) && (create::textureEdgeClamp == false)) &&
         (create(unsigned_int,unsigned_int)::warned == '\0')) {
        poVar5 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"OpenGL extension SGIS_texture_edge_clamp unavailable",0x34);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar5 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"Artifacts may occur along texture edges",0x27);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        poVar5 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"Ensure that hardware acceleration is enabled if available",0x39);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        create(unsigned_int,unsigned_int)::warned = '\x01';
      }
      if (create(unsigned_int,unsigned_int)::textureSrgb == '\0') {
        create();
      }
      if ((this->m_sRgb == true) && (create::textureSrgb == false)) {
        if (create(unsigned_int,unsigned_int)::warned == '\0') {
          poVar5 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"OpenGL extension EXT_texture_sRGB unavailable",0x2d);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          poVar5 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"Automatic sRGB to linear conversion disabled",0x2c);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          create(unsigned_int,unsigned_int)::warned = '\x01';
        }
        this->m_sRgb = false;
      }
      (*sf_glad_glBindTexture)(0xde1,this->m_texture);
      GVar9 = 0x1908;
      if (this->m_sRgb != false) {
        GVar9 = 0x8c43;
      }
      (*sf_glad_glTexImage2D)
                (0xde1,0,GVar9,(this->m_actualSize).x,(this->m_actualSize).y,0,0x1908,0x1401,
                 (void *)0x0);
      GVar9 = 0x2900;
      if ((create::textureEdgeClamp & 1U) != 0) {
        GVar9 = 0x812f;
      }
      if (this->m_isRepeated != false) {
        GVar9 = 0x2901;
      }
      (*sf_glad_glTexParameteri)(0xde1,0x2802,GVar9);
      GVar9 = 0x2900;
      if ((create::textureEdgeClamp & 1U) != 0) {
        GVar9 = 0x812f;
      }
      if (this->m_isRepeated != false) {
        GVar9 = 0x2901;
      }
      (*sf_glad_glTexParameteri)(0xde1,0x2803,GVar9);
      (*sf_glad_glTexParameteri)(0xde1,0x2800,this->m_isSmooth | 0x2600);
      (*sf_glad_glTexParameteri)(0xde1,0x2801,this->m_isSmooth | 0x2600);
      Lock::Lock((Lock *)&texture,(Mutex *)&(anonymous_namespace)::TextureImpl::idMutex);
      UVar1 = (anonymous_namespace)::TextureImpl::getUniqueId()::id;
      (anonymous_namespace)::TextureImpl::getUniqueId()::id =
           (anonymous_namespace)::TextureImpl::getUniqueId()::id + 1;
      Lock::~Lock((Lock *)&texture);
      this->m_cacheId = UVar1;
      this->m_hasMipmap = false;
      priv::TextureSaver::~TextureSaver(&save);
    }
    else {
      poVar5 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"Failed to create texture, its internal size is too high ",0x38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"x",1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"maximum is ",0xb);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"x",1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    GlResource::TransientContextLock::~TransientContextLock(&lock);
  }
  return SUB41(local_34,0);
}

Assistant:

bool Texture::create(unsigned int width, unsigned int height)
{
    // Check if texture parameters are valid before creating it
    if ((width == 0) || (height == 0))
    {
        err() << "Failed to create texture, invalid size (" << width << "x" << height << ")" << std::endl;
        return false;
    }

    TransientContextLock lock;

    // Make sure that extensions are initialized
    priv::ensureExtensionsInit();

    // Compute the internal texture dimensions depending on NPOT textures support
    Vector2u actualSize(getValidSize(width), getValidSize(height));

    // Check the maximum texture size
    unsigned int maxSize = getMaximumSize();
    if ((actualSize.x > maxSize) || (actualSize.y > maxSize))
    {
        err() << "Failed to create texture, its internal size is too high "
              << "(" << actualSize.x << "x" << actualSize.y << ", "
              << "maximum is " << maxSize << "x" << maxSize << ")"
              << std::endl;
        return false;
    }

    // All the validity checks passed, we can store the new texture settings
    m_size.x        = width;
    m_size.y        = height;
    m_actualSize    = actualSize;
    m_pixelsFlipped = false;
    m_fboAttachment = false;

    // Create the OpenGL texture if it doesn't exist yet
    if (!m_texture)
    {
        GLuint texture;
        glCheck(glGenTextures(1, &texture));
        m_texture = texture;
    }

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    static bool textureEdgeClamp = GLEXT_texture_edge_clamp || GLEXT_GL_VERSION_1_2 || Context::isExtensionAvailable("GL_EXT_texture_edge_clamp");

    if (!m_isRepeated && !textureEdgeClamp)
    {
        static bool warned = false;

        if (!warned)
        {
            err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
            err() << "Artifacts may occur along texture edges" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

            warned = true;
        }
    }

    static bool textureSrgb = GLEXT_texture_sRGB;

    if (m_sRgb && !textureSrgb)
    {
        static bool warned = false;

        if (!warned)
        {
#ifndef SFML_OPENGL_ES
            err() << "OpenGL extension EXT_texture_sRGB unavailable" << std::endl;
#else
            err() << "OpenGL ES extension EXT_sRGB unavailable" << std::endl;
#endif
            err() << "Automatic sRGB to linear conversion disabled" << std::endl;

            warned = true;
        }

        m_sRgb = false;
    }

    // Initialize the texture
    glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
    glCheck(glTexImage2D(GL_TEXTURE_2D, 0, (m_sRgb ? GLEXT_GL_SRGB8_ALPHA8 : GL_RGBA), static_cast<GLsizei>(m_actualSize.x), static_cast<GLsizei>(m_actualSize.y), 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    m_cacheId = TextureImpl::getUniqueId();

    m_hasMipmap = false;

    return true;
}